

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void processJob(UA_Server *server,UA_Job *job)

{
  UA_ServerCallback UNRECOVERED_JUMPTABLE;
  UA_ByteString *message;
  UA_Connection *message_00;
  
  switch(job->type) {
  case UA_JOBTYPE_NOTHING:
    return;
  case UA_JOBTYPE_DETACHCONNECTION:
    UA_Connection_detachSecureChannel((job->job).closeConnection);
    return;
  case UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER:
    message_00 = (UA_Connection *)&(job->job).binaryMessage.message;
    UA_Server_processBinaryMessage(server,(job->job).closeConnection,(UA_ByteString *)message_00);
    server = (UA_Server *)(job->job).closeConnection;
    UNRECOVERED_JUMPTABLE = *(UA_ServerCallback *)&server->config;
    break;
  case UA_JOBTYPE_BINARYMESSAGE_ALLOCATED:
    message = &(job->job).binaryMessage.message;
    UA_Server_processBinaryMessage(server,(job->job).closeConnection,message);
    UA_ByteString_deleteMembers(message);
    return;
  case UA_JOBTYPE_METHODCALL:
  case UA_JOBTYPE_METHODCALL_DELAYED:
    message_00 = (job->job).closeConnection;
    UNRECOVERED_JUMPTABLE = (job->job).methodCall.method;
    break;
  default:
    UA_LOG_WARNING((server->config).logger,UA_LOGCATEGORY_SERVER,
                   "Trying to execute a job of unknown type");
    return;
  }
  (*UNRECOVERED_JUMPTABLE)((UA_Connection *)server,(UA_ByteString *)message_00);
  return;
}

Assistant:

static void
processJob(UA_Server *server, UA_Job *job) {
    UA_ASSERT_RCU_UNLOCKED();
    UA_RCU_LOCK();
    switch(job->type) {
    case UA_JOBTYPE_NOTHING:
        break;
    case UA_JOBTYPE_DETACHCONNECTION:
        UA_Connection_detachSecureChannel(job->job.closeConnection);
        break;
    case UA_JOBTYPE_BINARYMESSAGE_NETWORKLAYER:
        UA_Server_processBinaryMessage(server, job->job.binaryMessage.connection,
                                       &job->job.binaryMessage.message);
        UA_Connection *connection = job->job.binaryMessage.connection;
        connection->releaseRecvBuffer(connection, &job->job.binaryMessage.message);
        break;
    case UA_JOBTYPE_BINARYMESSAGE_ALLOCATED:
        UA_Server_processBinaryMessage(server, job->job.binaryMessage.connection,
                                       &job->job.binaryMessage.message);
        UA_ByteString_deleteMembers(&job->job.binaryMessage.message);
        break;
    case UA_JOBTYPE_METHODCALL:
    case UA_JOBTYPE_METHODCALL_DELAYED:
        job->job.methodCall.method(server, job->job.methodCall.data);
        break;
    default:
        UA_LOG_WARNING(server->config.logger, UA_LOGCATEGORY_SERVER,
                       "Trying to execute a job of unknown type");
        break;
    }
    UA_RCU_UNLOCK();
}